

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall
kj::_::ImmediateBrokenPromiseNode::get(ImmediateBrokenPromiseNode *this,ExceptionOrValue *output)

{
  NullableValue<kj::Exception>::emplace<kj::Exception>
            ((NullableValue<kj::Exception> *)output,&this->exception);
  return;
}

Assistant:

void ImmediateBrokenPromiseNode::get(ExceptionOrValue& output) noexcept {
  output.exception = kj::mv(exception);
}